

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O1

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::ordering(SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
           *this,MatrixType *a,ConstCholMatrixPtr *pmat,CholMatrixType *ap)

{
  Index rows;
  OrderingType ordering;
  CholMatrixType C;
  PermutationMatrix<_1,__1,_int> *local_80;
  SparseMatrix<double,_0,_int> local_78;
  
  rows = a->m_innerSize;
  *pmat = ap;
  local_78.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_78.m_outerSize = -1;
  local_78.m_innerSize = 0;
  local_78.m_outerIndex = (StorageIndex *)0x0;
  local_78.m_innerNonZeros = (StorageIndex *)0x0;
  local_78.m_data.m_values = (Scalar *)0x0;
  local_78.m_data.m_indices = (StorageIndex *)0x0;
  local_78.m_data.m_size = 0;
  local_78.m_data.m_allocatedSize = 0;
  SparseMatrix<double,_0,_int>::resize(&local_78,0,0);
  internal::permute_symm_to_fullsymm<1,Eigen::SparseMatrix<double,0,int>,0>
            (a,&local_78,(StorageIndex *)0x0);
  AMDOrdering<int>::operator()((AMDOrdering<int> *)&local_80,&local_78,&this->m_Pinv);
  free(local_78.m_outerIndex);
  free(local_78.m_innerNonZeros);
  internal::CompressedStorage<double,_int>::~CompressedStorage(&local_78.m_data);
  if ((this->m_Pinv).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
      .m_rows < 1) {
    if ((this->m_P).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != 0) {
      free((this->m_P).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      (this->m_P).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = (int *)0x0;
    }
    (this->m_P).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
  }
  else {
    local_80 = &this->m_Pinv;
    PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
              ((PermutationMatrix<_1,_1,int> *)&local_78,
               (InverseImpl<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::PermutationStorage> *)
               &local_80);
    PermutationMatrix<-1,_-1,_int>::operator=
              (&this->m_P,(PermutationMatrix<_1,__1,_int> *)&local_78);
    free((void *)CONCAT71(local_78._1_7_,
                          local_78.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
                          super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue));
  }
  SparseMatrix<double,_0,_int>::resize(ap,rows,rows);
  internal::permute_symm_to_symm<1,2,Eigen::SparseMatrix<double,0,int>,0>
            (a,ap,(this->m_P).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data);
  return;
}

Assistant:

void SimplicialCholeskyBase<Derived>::ordering(const MatrixType& a, ConstCholMatrixPtr &pmat, CholMatrixType& ap)
{
  eigen_assert(a.rows()==a.cols());
  const Index size = a.rows();
  pmat = &ap;
  // Note that ordering methods compute the inverse permutation
  if(!internal::is_same<OrderingType,NaturalOrdering<Index> >::value)
  {
    {
      CholMatrixType C;
      C = a.template selfadjointView<UpLo>();
      
      OrderingType ordering;
      ordering(C,m_Pinv);
    }

    if(m_Pinv.size()>0) m_P = m_Pinv.inverse();
    else                m_P.resize(0);
    
    ap.resize(size,size);
    ap.template selfadjointView<Upper>() = a.template selfadjointView<UpLo>().twistedBy(m_P);
  }
  else
  {
    m_Pinv.resize(0);
    m_P.resize(0);
    if(int(UpLo)==int(Lower) || MatrixType::IsRowMajor)
    {
      // we have to transpose the lower part to to the upper one
      ap.resize(size,size);
      ap.template selfadjointView<Upper>() = a.template selfadjointView<UpLo>();
    }
    else
      internal::simplicial_cholesky_grab_input<CholMatrixType,MatrixType>::run(a, pmat, ap);
  }  
}